

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Group.c
# Opt level: O2

void Llb_ManGroupMarkNodes_rec(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  int iVar1;
  int iVar2;
  
  while( true ) {
    iVar1 = pObj->TravId;
    iVar2 = p->nTravIds;
    if ((iVar1 == iVar2) || (pObj->TravId = iVar2, iVar1 == iVar2 + -1)) break;
    if ((*(uint *)&pObj->field_0x18 & 7) - 7 < 0xfffffffe) {
      __assert_fail("Aig_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Group.c"
                    ,0x128,"void Llb_ManGroupMarkNodes_rec(Aig_Man_t *, Aig_Obj_t *)");
    }
    Llb_ManGroupMarkNodes_rec(p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
    pObj = (Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
  }
  return;
}

Assistant:

void Llb_ManGroupMarkNodes_rec( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return;
    if ( Aig_ObjIsTravIdPrevious(p, pObj) )
    {
        Aig_ObjSetTravIdCurrent(p, pObj);
        return;
    }
    Aig_ObjSetTravIdCurrent(p, pObj);
    assert( Aig_ObjIsNode(pObj) );
    Llb_ManGroupMarkNodes_rec( p, Aig_ObjFanin0(pObj) );
    Llb_ManGroupMarkNodes_rec( p, Aig_ObjFanin1(pObj) );
}